

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O1

void do_cmd_fire(command *cmd)

{
  wchar_t shots;
  _Bool _Var1;
  wchar_t wVar2;
  object *bow;
  char *fmt;
  object *obj;
  wchar_t dir;
  object *local_30;
  wchar_t local_24;
  
  shots = (player->state).num_shots;
  bow = equipped_item_by_slot_name(player,"shooting");
  _Var1 = player_get_resume_normal_shape(player,cmd);
  if ((_Var1) &&
     (wVar2 = cmd_get_item((command_conflict *)cmd,"item",&local_30,"Fire which ammunition?",
                           "You have no suitable ammunition to fire.",obj_can_fire,L'Ȏ'),
     wVar2 == L'\0')) {
    if ((bow == (object *)0x0) || ((player->state).ammo_tval == L'\0')) {
      fmt = "You have nothing to fire with.";
    }
    else {
      _Var1 = item_is_available(local_30);
      if (_Var1) {
        if ((player->state).ammo_tval == (uint)local_30->tval) {
          wVar2 = cmd_get_target((command_conflict *)cmd,"target",&local_24);
          if (wVar2 != L'\0') {
            return;
          }
          player_confuse_dir(player,&local_24,false);
          ranged_helper(player,bow,local_30,local_24,shots,make_ranged_shot);
          return;
        }
        fmt = "That ammo cannot be fired by your current weapon.";
      }
      else {
        fmt = "That item is not within your reach.";
      }
    }
    msg(fmt);
  }
  return;
}

Assistant:

void do_cmd_fire(struct command *cmd) {
	int dir;
	int shots = player->state.num_shots;

	ranged_attack attack = make_ranged_shot;

	struct object *bow = equipped_item_by_slot_name(player, "shooting");
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		return;
	}

	/* Get arguments */
	if (cmd_get_item(cmd, "item", &obj,
			/* Prompt */ "Fire which ammunition?",
			/* Error  */ "You have no suitable ammunition to fire.",
			/* Filter */ obj_can_fire,
			/* Choice */ USE_INVEN | USE_QUIVER | USE_FLOOR | QUIVER_TAGS)
		!= CMD_OK)
		return;

	/* Require a usable launcher */
	if (!bow || !player->state.ammo_tval) {
		msg("You have nothing to fire with.");
		return;
	}

	/* Check the item being fired is usable by the player. */
	if (!item_is_available(obj)) {
		msg("That item is not within your reach.");
		return;
	}

	/* Check the ammo can be used with the launcher */
	if (obj->tval != player->state.ammo_tval) {
		msg("That ammo cannot be fired by your current weapon.");
		return;
	}

	if (cmd_get_target(cmd, "target", &dir) == CMD_OK)
		player_confuse_dir(player, &dir, false);
	else
		return;

	ranged_helper(player, bow, obj, dir, shots, attack);
}